

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  ConfigurationType CVar1;
  Level LVar2;
  pointer pcVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar8;
  _func_int **pp_Var9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string *psVar10;
  TypedConfigurations *pTVar11;
  string_t *this_00;
  pointer ppCVar12;
  Configuration *conf;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  string_t local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  string_t local_188;
  undefined1 local_168 [32];
  string_t local_148;
  string_t local_128;
  string_t local_108;
  undefined1 local_e8 [16];
  code *local_d8;
  code *local_d0;
  long *plVar7;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  withFileSizeLimit.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  withFileSizeLimit.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  withFileSizeLimit.super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
  plVar7 = (long *)CONCAT44(extraout_var,iVar6);
  do {
    iVar6 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])(configurations);
    if (plVar7 == (long *)CONCAT44(extraout_var_00,iVar6)) {
      iVar6 = (*(configurations->
                super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
      for (plVar7 = (long *)CONCAT44(extraout_var_01,iVar6);
          iVar6 = (*(configurations->
                    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                    .super_ThreadSafe._vptr_ThreadSafe[6])(configurations),
          plVar7 != (long *)CONCAT44(extraout_var_02,iVar6); plVar7 = plVar7 + 1) {
        lVar4 = *plVar7;
        if (*(int *)(lVar4 + 0xc) == 0x10) {
          insertFile(this,*(Level *)(lVar4 + 8),(string *)(lVar4 + 0x10));
        }
      }
      for (ppCVar12 = withFileSizeLimit.
                      super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppCVar12 !=
          withFileSizeLimit.
          super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppCVar12 = ppCVar12 + 1) {
        local_e8._8_8_ = (__buckets_ptr)0x0;
        local_e8._0_8_ = defaultPreRollOutCallback;
        local_d0 = utils::std::
                   _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                   ::_M_invoke;
        local_d8 = utils::std::
                   _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                   ::_M_manager;
        unsafeValidateFileRolling(this,(*ppCVar12)->m_level,(PreRollOutCallback *)local_e8);
        utils::std::_Function_base::~_Function_base((_Function_base *)local_e8);
      }
      std::_Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>::~_Vector_base
                ((_Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                 &withFileSizeLimit);
      return;
    }
    conf = (Configuration *)*plVar7;
    CVar1 = conf->m_configurationType;
    switch(CVar1) {
    case Enabled:
      LVar2 = conf->m_level;
      psVar10 = &conf->m_value;
      std::__cxx11::string::string((string *)&local_108,(string *)psVar10);
      bVar5 = build::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_108,psVar10);
      local_e8[0] = bVar5;
      setValue<bool>(this,LVar2,(bool *)local_e8,&this->m_enabledMap,true);
      this_00 = &local_108;
      break;
    case ToFile:
      LVar2 = conf->m_level;
      psVar10 = &conf->m_value;
      std::__cxx11::string::string((string *)&local_128,(string *)psVar10);
      bVar5 = build::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_128,psVar10);
      local_e8[0] = bVar5;
      setValue<bool>(this,LVar2,(bool *)local_e8,&this->m_toFileMap,true);
      this_00 = &local_128;
      break;
    case ToFile|Enabled:
    case ToStandardOutput|Enabled:
    case ToStandardOutput|ToFile:
    case ToStandardOutput|ToFile|Enabled:
      goto switchD_0016dbd8_caseD_3;
    case ToStandardOutput:
      LVar2 = conf->m_level;
      psVar10 = &conf->m_value;
      std::__cxx11::string::string((string *)(local_168 + 0x20),(string *)psVar10);
      bVar5 = build::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(local_168 + 0x20),psVar10);
      local_e8[0] = bVar5;
      setValue<bool>(this,LVar2,(bool *)local_e8,&this->m_toStandardOutputMap,true);
      this_00 = (string_t *)(local_168 + 0x20);
      break;
    case Format:
      LVar2 = conf->m_level;
      pcVar3 = (conf->m_value)._M_dataplus._M_p;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_1e8,pcVar3,pcVar3 + (conf->m_value)._M_string_length);
      LogFormat::LogFormat((LogFormat *)local_e8,LVar2,&local_1e8);
      setValue<el::base::LogFormat>(this,LVar2,(LogFormat *)local_e8,&this->m_logFormatMap,true);
      LogFormat::~LogFormat((LogFormat *)local_e8);
      this_00 = &local_1e8;
      break;
    default:
      if (CVar1 == MillisecondsWidth) {
        pTVar11 = (TypedConfigurations *)local_168;
        std::__cxx11::string::string((string *)local_168,(string *)&conf->m_value);
        uVar8 = getULong(pTVar11,(string *)local_168);
        SubsecondPrecision::init
                  ((SubsecondPrecision *)local_e8,(EVP_PKEY_CTX *)(uVar8 & 0xffffffff));
        setValue<el::base::SubsecondPrecision>
                  (this,Global,(SubsecondPrecision *)local_e8,&this->m_subsecondPrecisionMap,true);
        this_00 = (string_t *)local_168;
        break;
      }
      if (CVar1 == PerformanceTracking) {
        psVar10 = &conf->m_value;
        std::__cxx11::string::string((string *)(local_1a8 + 0x20),(string *)psVar10);
        bVar5 = build::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)(local_1a8 + 0x20),psVar10);
        local_e8[0] = bVar5;
        setValue<bool>(this,Global,(bool *)local_e8,&this->m_performanceTrackingMap,true);
        this_00 = (string_t *)(local_1a8 + 0x20);
        break;
      }
      if (CVar1 == MaxLogFileSize) {
        pTVar11 = (TypedConfigurations *)local_1a8;
        std::__cxx11::string::string((string *)pTVar11,(string *)&conf->m_value);
        pp_Var9 = (_func_int **)getULong(pTVar11,(string *)local_1a8);
        std::__cxx11::string::~string((string *)local_1a8);
        local_e8._0_8_ = pp_Var9;
        setValue<unsigned_long>
                  (this,conf->m_level,(unsigned_long *)local_e8,&this->m_maxLogFileSizeMap,true);
        if (pp_Var9 != (_func_int **)0x0) {
          std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::push_back
                    ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                     &withFileSizeLimit,&conf);
        }
      }
      else if (CVar1 == LogFlushThreshold) {
        LVar2 = conf->m_level;
        pTVar11 = (TypedConfigurations *)local_1c8;
        std::__cxx11::string::string((string *)local_1c8,(string *)&conf->m_value);
        local_e8._0_8_ = getULong(pTVar11,(string *)local_1c8);
        setValue<unsigned_long>
                  (this,LVar2,(unsigned_long *)local_e8,&this->m_logFlushThresholdMap,true);
        this_00 = (string_t *)local_1c8;
        break;
      }
      goto switchD_0016dbd8_caseD_3;
    }
    std::__cxx11::string::~string((string *)this_00);
switchD_0016dbd8_caseD_3:
    plVar7 = plVar7 + 1;
  } while( true );
}

Assistant:

void TypedConfigurations::build(Configurations* configurations) {
  base::threading::ScopedLock scopedLock(lock());
  auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
    base::utils::Str::trim(boolStr);
    return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
  };
  std::vector<Configuration*> withFileSizeLimit;
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    // We cannot use switch on strong enums because Intel C++ dont support them yet
    if (conf->configurationType() == ConfigurationType::Enabled) {
      setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
    } else if (conf->configurationType() == ConfigurationType::ToFile) {
      setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
    } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
      setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
    } else if (conf->configurationType() == ConfigurationType::Filename) {
      // We do not yet configure filename but we will configure in another
      // loop. This is because if file cannot be created, we will force ToFile
      // to be false. Because configuring logger is not necessarily performance
      // sensative operation, we can live with another loop; (by the way this loop
      // is not very heavy either)
    } else if (conf->configurationType() == ConfigurationType::Format) {
      setValue(conf->level(), base::LogFormat(conf->level(),
                                              base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
    } else if (conf->configurationType() == ConfigurationType::SubsecondPrecision) {
      setValue(Level::Global,
               base::SubsecondPrecision(static_cast<int>(getULong(conf->value()))), &m_subsecondPrecisionMap);
    } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
      setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
    } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
      auto v = getULong(conf->value());
      setValue(conf->level(), static_cast<std::size_t>(v), &m_maxLogFileSizeMap);
      if (v != 0) {
        withFileSizeLimit.push_back(conf);
      }
    } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
    }
  }
  // As mentioned earlier, we will now set filename configuration in separate loop to deal with non-existent files
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    if (conf->configurationType() == ConfigurationType::Filename) {
      insertFile(conf->level(), conf->value());
    }
  }
  for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
       conf != withFileSizeLimit.end(); ++conf) {
    // This is not unsafe as mutex is locked in currect scope
    unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
  }
}